

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O3

bool __thiscall Vector::compare(Vector *this,void *ptr,void *other)

{
  char cVar1;
  long lVar2;
  Type *pTVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  void *pvVar7;
  
  lVar2 = (**(code **)(*(long *)this + 200))();
  pTVar3 = (Type *)Typelib::Indirect::getIndirection();
  lVar4 = Typelib::Type::getSize();
  lVar5 = (**(code **)(*(long *)this + 200))(this,other);
  if (lVar2 == lVar5) {
    if (lVar2 == 0) {
      cVar1 = '\x01';
    }
    else {
      pvVar6 = *ptr;
      pvVar7 = *other;
      do {
        lVar2 = lVar2 + -1;
        cVar1 = Typelib::compare(pvVar6,pvVar7,pTVar3);
        if (cVar1 == '\0') {
          return false;
        }
        pvVar7 = (void *)((long)pvVar7 + lVar4);
        pvVar6 = (void *)((long)pvVar6 + lVar4);
      } while (lVar2 != 0);
    }
  }
  else {
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool Vector::compare(void* ptr, void* other) const
{
    std::vector<uint8_t>* a_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);
    std::vector<uint8_t>* b_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(other);

    size_t   element_count = getElementCount(a_ptr);
    Type const& element_t  = getIndirection();
    size_t   element_size  = element_t.getSize();
    if (element_count != getElementCount(b_ptr))
        return false;

    uint8_t* base_a = &(*a_ptr)[0];
    uint8_t* base_b = &(*b_ptr)[0];
    for (size_t i = 0; i < element_count; ++i)
    {
        /// !!! We don't use element_layout here as comparing requires a
        // different layout. If performance becomes an issue, we'll have to
        // precompute both
        if (!Typelib::compare(
                    base_a + i * element_size,
                    base_b + i * element_size, element_t))
            return false;
    }
    return true;
}